

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

T_INDEX __thiscall
Nova::Grid<float,_2>::Clamp_To_Cell(Grid<float,_2> *this,TV *X,int number_of_ghost_cells)

{
  undefined4 in_register_00000014;
  Grid<float,_2> local_54;
  Vector<int,_2,_true> local_2c;
  T_INDEX index;
  int number_of_ghost_cells_local;
  TV *X_local;
  Grid<float,_2> *this_local;
  
  register0x00000010 =
       (Vector<float,_2,_true> *)CONCAT44(in_register_00000014,number_of_ghost_cells);
  Vector<float,_2,_true>::operator-(&local_54.domain.max_corner,register0x00000010);
  Vector<float,_2,_true>::operator*(&local_54.dX,&local_54.domain.max_corner);
  Vector<int,_2,_true>::Vector<float>((Vector<int,_2,_true> *)&local_54.one_over_dX,&local_54.dX);
  Vector<int,_2,_true>::operator+(&local_2c,(int)&local_54 + 0x20);
  Cell_Indices(&local_54,(int)X);
  Range<int,_2>::Clamp((Range<int,_2> *)this,&local_54.counts);
  return (T_INDEX)(T_STORAGE)this;
}

Assistant:

T_INDEX Clamp_To_Cell(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index=T_INDEX((X-domain.min_corner)*one_over_dX)+1;
        return Cell_Indices(number_of_ghost_cells).Clamp(index);
    }